

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
::expand(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
         *this)

{
  undefined4 *puVar1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pFVar2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pFVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar4 = sVar7 * 0x30;
  if (uVar4 == 0) {
    pFVar3 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x21) {
    pFVar3 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    pFVar3 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    pFVar3 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pFVar3 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             ::operator_new(uVar4,0x10);
  }
  if (this->_capacity != 0) {
    uVar4 = this->_capacity;
    if (uVar4 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        puVar1 = (undefined4 *)((long)(this->_stack->numeral)._val + lVar5 + -8);
        *(undefined4 *)((long)(pFVar3->numeral)._val + lVar5 + -8) = *puVar1;
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)((long)&(pFVar3->numeral)._val[0]._mp_alloc + lVar5),
                   (IntegerConstantType *)(puVar1 + 2));
        *(undefined4 *)
         ((long)&(((AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                  (&pFVar3->numeral + 1))->_term)._id + lVar5) = puVar1[6];
        *(undefined8 *)
         ((long)&(((AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                  (&pFVar3->numeral + 1))->_term)._ptr + lVar5) = *(undefined8 *)(puVar1 + 8);
        *(undefined4 *)((long)(&pFVar3->numeral + 2) + lVar5) = puVar1[10];
        mpz_clear((__mpz_struct *)((long)&(this->_stack->numeral)._val[0]._mp_alloc + lVar5));
        uVar6 = uVar6 + 1;
        uVar4 = this->_capacity;
        lVar5 = lVar5 + 0x30;
      } while (uVar6 < uVar4);
    }
    pFVar2 = this->_stack;
    if (pFVar2 != (FoundVarInLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
      uVar4 = uVar4 * 0x30;
      if (uVar4 == 0) {
        *(undefined8 *)pFVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFVar2;
      }
      else if (uVar4 < 0x11) {
        *(undefined8 *)pFVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pFVar2;
      }
      else if (uVar4 < 0x19) {
        *(undefined8 *)pFVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pFVar2;
      }
      else if (uVar4 < 0x21) {
        *(undefined8 *)pFVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pFVar2;
      }
      else if (uVar4 < 0x31) {
        *(undefined8 *)pFVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pFVar2;
      }
      else if (uVar4 < 0x41) {
        *(undefined8 *)pFVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFVar2;
      }
      else {
        operator_delete(pFVar2,0x10);
      }
    }
  }
  this->_stack = pFVar3;
  this->_cursor = pFVar3 + this->_capacity;
  this->_end = pFVar3 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }